

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefifind.cpp
# Opt level: O1

USTATUS __thiscall
UEFIFind::find(UEFIFind *this,UINT8 mode,bool count,CBString *hexPattern,CBString *result)

{
  UModelIndex index;
  bool bVar1;
  UINT8 UVar2;
  USTATUS UVar3;
  _Base_ptr p_Var4;
  UByteArray data;
  pair<UModelIndex,_UModelIndex> indexes;
  set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
  files;
  UModelIndex root;
  CBString local_138;
  undefined8 *local_118 [2];
  undefined8 local_108 [2];
  _func_int **local_f8;
  _Base_ptr p_Stack_f0;
  _Base_ptr local_e8;
  _Base_ptr p_Stack_e0;
  uint64_t local_d8;
  _Base_ptr p_Stack_d0;
  CBString local_c0;
  _Rb_tree<std::pair<UModelIndex,_UModelIndex>,_std::pair<UModelIndex,_UModelIndex>,_std::_Identity<std::pair<UModelIndex,_UModelIndex>_>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
  local_a0;
  EFI_GUID EStack_70;
  CBString CStack_60;
  TreeModel local_48;
  TreeModel *local_38;
  
  local_a0._M_impl._0_8_ = 0xffffffffffffffff;
  local_a0._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  TreeModel::index(&local_48,(char *)this->model,0);
  local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a0._M_impl.super__Rb_tree_header._M_header;
  local_a0._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_a0._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
  Bstrlib::CBString::operator=(result,anon_var_dwarf_2abd1 + 0x10);
  index.i._0_1_ = local_48.markingEnabledFlag;
  index.i._1_1_ = local_48.markingDarkModeFlag;
  index.i._2_6_ = local_48._10_6_;
  index._0_8_ = local_48.rootItem;
  index.m = local_38;
  UVar3 = findFileRecursive(this,index,hexPattern,mode,
                            (set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
                             *)&local_a0);
  if (UVar3 == 0) {
    if (count) {
      if (local_a0._M_impl.super__Rb_tree_header._M_node_count != 0) {
        usprintf((CBString *)&local_f8,"%lu\n");
        Bstrlib::CBString::operator+=(result,(CBString *)&local_f8);
        Bstrlib::CBString::~CBString((CBString *)&local_f8);
      }
    }
    else if ((_Rb_tree_header *)local_a0._M_impl.super__Rb_tree_header._M_header._M_left !=
             &local_a0._M_impl.super__Rb_tree_header) {
      p_Var4 = local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_118[0] = local_108;
        std::__cxx11::string::_M_construct((ulong)local_118,'\x10');
        local_f8 = *(_func_int ***)(p_Var4 + 1);
        p_Stack_f0 = p_Var4[1]._M_parent;
        local_e8 = p_Var4[1]._M_left;
        p_Stack_e0 = p_Var4[1]._M_right;
        local_d8 = *(uint64_t *)(p_Var4 + 2);
        p_Stack_d0 = p_Var4[2]._M_parent;
        bVar1 = TreeModel::hasEmptyHeader(this->model,(UModelIndex *)&local_f8);
        if (!bVar1) {
          TreeModel::header((UByteArray *)&local_c0,this->model,(UModelIndex *)&local_f8);
          UByteArray::left((UByteArray *)&local_138,(UByteArray *)&local_c0,0x10);
          std::__cxx11::string::_M_assign((string *)local_118);
          if (local_138._vptr_CBString != (_func_int **)&local_138.super_tagbstring.data) {
            operator_delete(local_138._vptr_CBString);
          }
          if (local_c0._vptr_CBString != (_func_int **)&local_c0.super_tagbstring.data) {
            operator_delete(local_c0._vptr_CBString);
          }
        }
        local_c0._vptr_CBString = (_func_int **)*local_118[0];
        local_c0.super_tagbstring._0_8_ = local_118[0][1];
        guidToUString(&local_138,(EFI_GUID *)&local_c0,true);
        Bstrlib::CBString::operator+=(result,&local_138);
        Bstrlib::CBString::~CBString(&local_138);
        if (((-1 < (int)p_Stack_e0) && (-1 < (long)p_Stack_e0)) && (p_Stack_d0 != (_Base_ptr)0x0)) {
          UVar2 = TreeModel::subtype(this->model,(UModelIndex *)&p_Stack_e0);
          if (UVar2 == '\x18') {
            TreeModel::header((UByteArray *)&local_138,this->model,(UModelIndex *)&p_Stack_e0);
            std::__cxx11::string::_M_assign((string *)local_118);
            if (local_138._vptr_CBString != (_func_int **)&local_138.super_tagbstring.data) {
              operator_delete(local_138._vptr_CBString);
            }
            Bstrlib::CBString::CBString(&local_c0," ");
            EStack_70._0_8_ = *(undefined8 *)((long)local_118[0] + 4);
            EStack_70.Data4 = *(UINT8 (*) [8])((long)local_118[0] + 0xc);
            guidToUString(&CStack_60,&EStack_70,true);
            Bstrlib::CBString::operator+(&local_138,&local_c0,&CStack_60);
            Bstrlib::CBString::operator+=(result,&local_138);
            Bstrlib::CBString::~CBString(&local_138);
            Bstrlib::CBString::~CBString(&CStack_60);
            Bstrlib::CBString::~CBString(&local_c0);
          }
        }
        Bstrlib::CBString::CBString(&local_138,"\n");
        Bstrlib::CBString::operator+=(result,&local_138);
        Bstrlib::CBString::~CBString(&local_138);
        if (local_118[0] != local_108) {
          operator_delete(local_118[0]);
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != &local_a0._M_impl.super__Rb_tree_header);
    }
    UVar3 = 0;
  }
  std::
  _Rb_tree<std::pair<UModelIndex,_UModelIndex>,_std::pair<UModelIndex,_UModelIndex>,_std::_Identity<std::pair<UModelIndex,_UModelIndex>_>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
  ::~_Rb_tree(&local_a0);
  return UVar3;
}

Assistant:

USTATUS UEFIFind::find(const UINT8 mode, const bool count, const UString & hexPattern, UString & result)
{
    UModelIndex root = model->index(0, 0);
    std::set<std::pair<UModelIndex, UModelIndex> > files;

    result.clear();

    USTATUS returned = findFileRecursive(root, hexPattern, mode, files);
    if (returned)
        return returned;
    
    if (count) {
        if (!files.empty())
            result += usprintf("%lu\n", files.size());
        return U_SUCCESS;
    }

    for (std::set<std::pair<UModelIndex, UModelIndex> >::const_iterator citer = files.begin(); citer != files.end(); ++citer) {
        UByteArray data(16, '\x00');
        std::pair<UModelIndex, UModelIndex> indexes = *citer;
        if (!model->hasEmptyHeader(indexes.first))
            data = model->header(indexes.first).left(16);
        result += guidToUString(readUnaligned((const EFI_GUID*)data.constData()));

        // Special case of freeform subtype GUID files
        if (indexes.second.isValid() && model->subtype(indexes.second) == EFI_SECTION_FREEFORM_SUBTYPE_GUID) {
            data = model->header(indexes.second);
            result += UString(" ") + (guidToUString(readUnaligned((const EFI_GUID*)(data.constData() + sizeof(EFI_COMMON_SECTION_HEADER)))));
        }
        
        result += UString("\n");
    }
    return U_SUCCESS;
}